

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O2

void __thiscall hdc::Class::addMethod(Class *this,Def *def)

{
  int iVar1;
  Def *local_40;
  string local_38;
  
  local_40 = def;
  std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::push_back(&this->methods,&local_40);
  Def::setClass(local_40,this);
  Def::setFile(local_40,this->file);
  iVar1 = this->methodCounter;
  this->methodCounter = iVar1 + 1;
  Def::setId(local_40,iVar1);
  Def::getName_abi_cxx11_(&local_38,local_40);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (iVar1 == 0) {
    std::vector<hdc::Def_*,_std::allocator<hdc::Def_*>_>::push_back(&this->constructors,&local_40);
  }
  else {
    Def::getName_abi_cxx11_(&local_38,local_40);
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (iVar1 == 0) {
      this->destructor = local_40;
    }
  }
  return;
}

Assistant:

void Class::addMethod(Def* def) {
    methods.push_back(def);
    def->setClass(this);
    def->setFile(this->file);
    def->setId(methodCounter++);
    //def->setGlobalID(0);

    if (def->getName().compare("init") == 0) {
        constructors.push_back(def);
    } else if (def->getName().compare("destroy") == 0) {
        destructor = def;
    }
}